

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy.c
# Opt level: O1

Socket * new_connection(SockAddr *addr,char *hostname,int port,_Bool privport,_Bool oobinline,
                       _Bool nodelay,_Bool keepalive,Plug *plug,Conf *conf,Interactor *itr)

{
  _func_void_Interactor_ptr_Seat_ptr *p_Var1;
  undefined8 uVar2;
  _Bool _Var3;
  uint uVar4;
  int iVar5;
  _STACK *p_Var6;
  ProxySocket *ps;
  Conf *pCVar7;
  LogPolicy *pLVar8;
  Seat *pSVar9;
  ProxyNegotiator *pPVar10;
  char *pcVar11;
  SockAddr *addr_00;
  SockAddr *pSVar12;
  _STACK *p_Var13;
  long lVar14;
  undefined7 in_register_00000009;
  char *pcVar15;
  char *pcVar16;
  Interactor *pIVar17;
  char *proxy_canonical_name;
  char addrbuf [256];
  
  pCVar7 = (Conf *)CONCAT71(in_register_00000009,privport);
  uVar4 = conf_get_int(conf,0xd);
  if ((uVar4 == 0) || (_Var3 = proxy_for_destination(addr,hostname,(int)conf,pCVar7), !_Var3)) {
    p_Var6 = sk_new((cmp *)addr);
  }
  else if (((2 < uVar4 - 6) ||
           (p_Var6 = (_STACK *)
                     sshproxy_new_connection
                               (addr,hostname,port,privport,oobinline,nodelay,keepalive,plug,conf,
                                itr), p_Var6 == (_STACK *)0x0)) &&
          (p_Var6 = (_STACK *)
                    platform_new_connection
                              (addr,hostname,port,privport,oobinline,nodelay,keepalive,plug,conf,itr
                              ), p_Var6 == (_STACK *)0x0)) {
    ps = (ProxySocket *)safemalloc(1,0x130,0);
    (ps->sock).vt = &ProxySocket_sockvt;
    (ps->plugimpl).vt = &ProxySocket_plugvt;
    (ps->interactor).vt = &ProxySocket_interactorvt;
    pCVar7 = conf_copy(conf);
    ps->conf = pCVar7;
    ps->plug = plug;
    ps->remote_addr = addr;
    ps->remote_port = port;
    ps->error = (char *)0x0;
    ps->pending_eof = false;
    ps->freeze = false;
    bufchain_init(&ps->pending_input_data);
    bufchain_init(&ps->pending_output_data);
    bufchain_init(&ps->pending_oob_output_data);
    bufchain_init(&ps->output_from_negotiator);
    ps->sub_socket = (Socket *)0x0;
    if (itr != (Interactor *)0x0) {
      ps->clientitr = itr;
      (ps->interactor).parent = itr;
      pLVar8 = (*itr->vt->logpolicy)(itr);
      ps->clientlp = pLVar8;
      pSVar9 = interactor_borrow_seat(ps->clientitr);
      ps->clientseat = pSVar9;
    }
    p_Var6 = (_STACK *)&ps->sock;
    if (uVar4 < 5) {
      pIVar17 = &ps->interactor;
      p_Var1 = (&ProxySocket_interactorvt.set_seat)[(int)uVar4];
      pPVar10 = (ProxyNegotiator *)(**(code **)p_Var1)(p_Var1);
      ps->pn = pPVar10;
      pPVar10->ps = ps;
      pPVar10->done = false;
      pPVar10->error = (char *)0x0;
      pPVar10->aborted = false;
      pPVar10->input = &ps->pending_input_data;
      if (ps->clientseat == (Seat *)0x0) {
        pIVar17 = (Interactor *)0x0;
      }
      pPVar10->itr = pIVar17;
      bufchain_sink_init(pPVar10->output,&ps->output_from_negotiator);
      uVar2 = *(undefined8 *)(p_Var1 + 0x18);
      pcVar11 = conf_get_str(conf,0xe);
      uVar4 = conf_get_int(conf,0xf);
      pcVar11 = dupprintf("Will use %s proxy at %s:%d to connect to %s:%d",uVar2,pcVar11,
                          (ulong)uVar4,hostname);
      (*plug->vt->log)(plug,PLUGLOG_PROXY_MSG,(SockAddr *)0x0,0,pcVar11,0);
      safefree(pcVar11);
      pcVar11 = conf_get_str(conf,0xe);
      iVar5 = conf_get_int(conf,3);
      pcVar16 = anon_var_dwarf_34f89 + 10;
      if (iVar5 == 2) {
        pcVar16 = " (IPv6)";
      }
      pcVar15 = " (IPv4)";
      if (iVar5 != 1) {
        pcVar15 = pcVar16;
      }
      pcVar11 = dupprintf("Looking up host \"%s\"%s for %s",pcVar11,pcVar15);
      (*plug->vt->log)(plug,PLUGLOG_PROXY_MSG,(SockAddr *)0x0,0,pcVar11,0);
      safefree(pcVar11);
      pcVar11 = conf_get_str(conf,0xe);
      iVar5 = conf_get_int(conf,3);
      addr_00 = sk_namelookup(pcVar11,&proxy_canonical_name,iVar5);
      pcVar11 = sk_addr_error(addr_00);
      if (pcVar11 == (char *)0x0) {
        safefree(proxy_canonical_name);
        sk_getaddr(addr_00,addrbuf,0x100);
        conf_get_int(conf,0xf);
        pcVar11 = dupprintf("Connecting to %s proxy at %s port %d",uVar2,addrbuf);
        (*plug->vt->log)(plug,PLUGLOG_PROXY_MSG,(SockAddr *)0x0,0,pcVar11,0);
        safefree(pcVar11);
        pSVar12 = sk_addr_dup(addr_00);
        ps->proxy_addr = pSVar12;
        iVar5 = conf_get_int(conf,0xf);
        ps->proxy_port = iVar5;
        ps->proxy_privport = privport;
        ps->proxy_oobinline = oobinline;
        ps->proxy_nodelay = nodelay;
        ps->proxy_keepalive = keepalive;
        p_Var13 = sk_new((cmp *)addr_00);
        ps->sub_socket = (Socket *)p_Var13;
        lVar14 = (**(code **)(*(long *)p_Var13 + 0x30))(p_Var13);
        if (lVar14 == 0) {
          (*ps->sub_socket->vt->set_frozen)(ps->sub_socket,false);
          proxy_negotiate(ps);
        }
      }
      else {
        ps->error = "Proxy error: Unable to resolve proxy host name";
        sk_addr_free(addr_00);
      }
    }
    else {
      ps->error = "Proxy error: Unknown proxy method";
    }
  }
  return (Socket *)p_Var6;
}

Assistant:

Socket *new_connection(SockAddr *addr, const char *hostname,
                       int port, bool privport,
                       bool oobinline, bool nodelay, bool keepalive,
                       Plug *plug, Conf *conf, Interactor *itr)
{
    int type = conf_get_int(conf, CONF_proxy_type);

    if (type != PROXY_NONE &&
        proxy_for_destination(addr, hostname, port, conf))
    {
        ProxySocket *ps;
        SockAddr *proxy_addr;
        char *proxy_canonical_name;
        Socket *sret;

        if ((type == PROXY_SSH_TCPIP ||
             type == PROXY_SSH_EXEC ||
             type == PROXY_SSH_SUBSYSTEM) &&
            (sret = sshproxy_new_connection(addr, hostname, port, privport,
                                            oobinline, nodelay, keepalive,
                                            plug, conf, itr)) != NULL)
            return sret;

        if ((sret = platform_new_connection(addr, hostname, port, privport,
                                            oobinline, nodelay, keepalive,
                                            plug, conf, itr)) != NULL)
            return sret;

        ps = snew(ProxySocket);
        ps->sock.vt = &ProxySocket_sockvt;
        ps->plugimpl.vt = &ProxySocket_plugvt;
        ps->interactor.vt = &ProxySocket_interactorvt;
        ps->conf = conf_copy(conf);
        ps->plug = plug;
        ps->remote_addr = addr;       /* will need to be freed on close */
        ps->remote_port = port;

        ps->error = NULL;
        ps->pending_eof = false;
        ps->freeze = false;

        bufchain_init(&ps->pending_input_data);
        bufchain_init(&ps->pending_output_data);
        bufchain_init(&ps->pending_oob_output_data);
        bufchain_init(&ps->output_from_negotiator);

        ps->sub_socket = NULL;

        /*
         * If we've been given an Interactor by the caller, set ourselves
         * up to work with it.
         */
        if (itr) {
            ps->clientitr = itr;
            interactor_set_child(ps->clientitr, &ps->interactor);
            ps->clientlp = interactor_logpolicy(ps->clientitr);
            ps->clientseat = interactor_borrow_seat(ps->clientitr);
        }

        const ProxyNegotiatorVT *vt;
        switch (type) {
          case PROXY_HTTP:
            vt = &http_proxy_negotiator_vt;
            break;
          case PROXY_SOCKS4:
            vt = &socks4_proxy_negotiator_vt;
            break;
          case PROXY_SOCKS5:
            vt = &socks5_proxy_negotiator_vt;
            break;
          case PROXY_TELNET:
            vt = &telnet_proxy_negotiator_vt;
            break;
          default:
            ps->error = "Proxy error: Unknown proxy method";
            return &ps->sock;
        }
        ps->pn = proxy_negotiator_new(vt);
        ps->pn->ps = ps;
        ps->pn->done = false;
        ps->pn->error = NULL;
        ps->pn->aborted = false;
        ps->pn->input = &ps->pending_input_data;
        /* Provide an Interactor to the negotiator if and only if we
         * are usefully able to ask interactive questions of the user */
        ps->pn->itr = ps->clientseat ? &ps->interactor : NULL;
        bufchain_sink_init(ps->pn->output, &ps->output_from_negotiator);

        {
            char *logmsg = dupprintf("Will use %s proxy at %s:%d to connect"
                                      " to %s:%d", vt->type,
                                      conf_get_str(conf, CONF_proxy_host),
                                      conf_get_int(conf, CONF_proxy_port),
                                      hostname, port);
            plug_log(plug, PLUGLOG_PROXY_MSG, NULL, 0, logmsg, 0);
            sfree(logmsg);
        }

        {
            char *logmsg = dns_log_msg(conf_get_str(conf, CONF_proxy_host),
                                       conf_get_int(conf, CONF_addressfamily),
                                       "proxy");
            plug_log(plug, PLUGLOG_PROXY_MSG, NULL, 0, logmsg, 0);
            sfree(logmsg);
        }

        /* look-up proxy */
        proxy_addr = sk_namelookup(conf_get_str(conf, CONF_proxy_host),
                                   &proxy_canonical_name,
                                   conf_get_int(conf, CONF_addressfamily));
        if (sk_addr_error(proxy_addr) != NULL) {
            ps->error = "Proxy error: Unable to resolve proxy host name";
            sk_addr_free(proxy_addr);
            return &ps->sock;
        }
        sfree(proxy_canonical_name);

        {
            char addrbuf[256], *logmsg;
            sk_getaddr(proxy_addr, addrbuf, lenof(addrbuf));
            logmsg = dupprintf("Connecting to %s proxy at %s port %d",
                               vt->type, addrbuf,
                               conf_get_int(conf, CONF_proxy_port));
            plug_log(plug, PLUGLOG_PROXY_MSG, NULL, 0, logmsg, 0);
            sfree(logmsg);
        }

        /* create the actual socket we will be using,
         * connected to our proxy server and port.
         */
        ps->proxy_addr = sk_addr_dup(proxy_addr);
        ps->proxy_port = conf_get_int(conf, CONF_proxy_port);
        ps->proxy_privport = privport;
        ps->proxy_oobinline = oobinline;
        ps->proxy_nodelay = nodelay;
        ps->proxy_keepalive = keepalive;
        ps->sub_socket = sk_new(proxy_addr, ps->proxy_port,
                                ps->proxy_privport, ps->proxy_oobinline,
                                ps->proxy_nodelay, ps->proxy_keepalive,
                                &ps->plugimpl);
        if (sk_socket_error(ps->sub_socket) != NULL)
            return &ps->sock;

        /* start the proxy negotiation process... */
        sk_set_frozen(ps->sub_socket, false);
        proxy_negotiate(ps);

        return &ps->sock;
    }

    /* no proxy, so just return the direct socket */
    return sk_new(addr, port, privport, oobinline, nodelay, keepalive, plug);
}